

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

int xmlPythonFileRead(void *context,char *buffer,int len)

{
  int in_EAX;
  uint uVar1;
  int iVar2;
  long *plVar3;
  void *__src;
  size_t __n;
  Py_ssize_t size;
  int local_28 [2];
  
  iVar2 = -1;
  if (context == (void *)0x0) {
    return -1;
  }
  local_28[0] = in_EAX;
  plVar3 = (long *)_PyObject_CallMethod_SizeT(context,"io_read","(i)",len);
  if (plVar3 == (long *)0x0) {
    puts("xmlPythonFileRead: result is NULL");
    return -1;
  }
  uVar1 = (uint)*(undefined8 *)(plVar3[1] + 0xa8);
  if ((uVar1 >> 0x1b & 1) == 0) {
    if ((uVar1 >> 0x1c & 1) == 0) {
      puts("xmlPythonFileRead: result is not a String");
      goto LAB_0013c454;
    }
    __src = (void *)PyUnicode_AsUTF8AndSize(plVar3,local_28);
    iVar2 = local_28[0];
  }
  else {
    iVar2 = PyBytes_Size(plVar3);
    __src = (void *)PyBytes_AsString(plVar3);
  }
  __n = (long)len;
  if (iVar2 <= len) {
    __n = (long)iVar2;
  }
  memcpy(buffer,__src,__n);
LAB_0013c454:
  *plVar3 = *plVar3 + -1;
  if (*plVar3 == 0) {
    _Py_Dealloc(plVar3);
  }
  return iVar2;
}

Assistant:

static int
xmlPythonFileRead (void * context, char * buffer, int len) {
    PyObject *file;
    PyObject *ret;
    int lenread = -1;
    char *data;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    ret = PyObject_CallMethod(file, (char *) "io_read", (char *) "(i)", len);
    if (ret == NULL) {
	printf("xmlPythonFileRead: result is NULL\n");
	return(-1);
    } else if (PyBytes_Check(ret)) {
	lenread = PyBytes_Size(ret);
	data = PyBytes_AsString(ret);
#ifdef PyUnicode_Check
    } else if (PyUnicode_Check (ret)) {
#if PY_VERSION_HEX >= 0x03030000
        Py_ssize_t size;
	const char *tmp;

	/* tmp doesn't need to be deallocated */
        tmp = PyUnicode_AsUTF8AndSize(ret, &size);

	lenread = (int) size;
	data = (char *) tmp;
#else
        PyObject *b;
	b = PyUnicode_AsUTF8String(ret);
	if (b == NULL) {
	    printf("xmlPythonFileRead: failed to convert to UTF-8\n");
	    return(-1);
	}
	lenread = PyBytes_Size(b);
	data = PyBytes_AsString(b);
	Py_DECREF(b);
#endif
#endif
    } else {
	printf("xmlPythonFileRead: result is not a String\n");
	Py_DECREF(ret);
	return(-1);
    }
    if (lenread > len)
	memcpy(buffer, data, len);
    else
	memcpy(buffer, data, lenread);
    Py_DECREF(ret);
    return(lenread);
}